

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O2

void SkipSubBlock(FScanner *sc)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  
  FScanner::MustGetStringName(sc,"{");
  for (iVar3 = 1; 0 < iVar3; iVar3 = (iVar3 + (uint)bVar1) - (uint)bVar2) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"{");
    bVar2 = FScanner::Compare(sc,"}");
  }
  return;
}

Assistant:

static void SkipSubBlock(FScanner &sc)
{
	sc.MustGetStringName("{");
	int depth = 1;
	while (depth > 0)
	{
		sc.MustGetString();
		if (sc.Compare("{")) depth++;
		if (sc.Compare("}")) depth--;
	}
}